

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::dec_e(CPU *this)

{
  CPU *this_local;
  
  dec_r8(this,&this->regs->e);
  return 1;
}

Assistant:

int CPU::dec_e() {
    dec_r8(regs.e);
    return 1;
}